

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestring.h
# Opt level: O2

int CBS_is_valid_asn1_oid(CBS *cbs)

{
  size_t sVar1;
  uint8_t uVar2;
  bool bVar3;
  
  if (cbs->len != 0) {
    sVar1 = 0;
    uVar2 = '\0';
    do {
      if (cbs->len == sVar1) {
        return (int)(-1 < (char)uVar2);
      }
      bVar3 = (char)uVar2 < '\0';
      uVar2 = cbs->data[sVar1];
      sVar1 = sVar1 + 1;
    } while (bVar3 || uVar2 != 0x80);
  }
  return 0;
}

Assistant:

OPENSSL_INLINE size_t CBS_len(const CBS *cbs) { return cbs->len; }